

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O1

jieba_words_t *
convert_words(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *words)

{
  pointer pbVar1;
  jieba_words_t *pjVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  pointer pbVar7;
  
  pbVar7 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = (words->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)pbVar7 - (long)pbVar1;
  sVar5 = lVar6 >> 5;
  pjVar2 = (jieba_words_t *)malloc(lVar6 >> 1);
  pjVar2->length = sVar5;
  ppcVar3 = (char **)malloc(lVar6 >> 2);
  pjVar2->words = ppcVar3;
  if (pbVar7 != pbVar1) {
    pbVar7 = (words->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pcVar4 = strdup((pbVar7->_M_dataplus)._M_p);
      ppcVar3[lVar6] = pcVar4;
      lVar6 = lVar6 + 1;
      pbVar7 = pbVar7 + 1;
    } while (sVar5 + (sVar5 == 0) != lVar6);
  }
  return pjVar2;
}

Assistant:

static jieba_words_t* convert_words(const std::vector<string>& words) {
    size_t len = words.size();
    jieba_words_t* res = static_cast<jieba_words_t*>(malloc(sizeof(jieba_words_t) * len));
    res->length = len;
    res->words = static_cast<char**>(malloc(sizeof(char*) * len));
    for (size_t i = 0; i < len; i++) {
        res->words[i] = strdup(words[i].c_str());
    }
    return res;
}